

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_3.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  void *pvVar1;
  NoActionMemLogger logger;
  CachedArena<cookmem::MmapArena> cachedArena;
  MmapArena arena;
  NoActionMemLogger local_2a9;
  CachedArena<cookmem::MmapArena> local_2a8;
  MmapArena local_298;
  undefined **local_288;
  CachedArena<cookmem::MmapArena> *local_280;
  NoActionMemLogger *local_278;
  MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void> local_270;
  
  local_2a8.m_arena = &local_298;
  local_298.m_minSize = 0x10000;
  local_298.m_prot = 3;
  local_298.m_flag = 0x22;
  local_2a8.m_tree.m_root = (Node *)0x0;
  local_288 = &PTR__MemContext_00105d90;
  local_280 = &local_2a8;
  local_278 = &local_2a9;
  local_270.m_arena = &local_2a8;
  local_270.m_logger = &local_2a9;
  memset(&local_270.m_footprintLimit,0,0x232);
  local_270.m_paddingByte = -0x33;
  pvVar1 = cookmem::
           MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::
           allocate(&local_270,100);
  pvVar1 = cookmem::
           MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::
           reallocate(&local_270,pvVar1,1000);
  cookmem::MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::
  deallocate(&local_270,pvVar1,0);
  local_288 = &PTR__MemContext_00105d90;
  cookmem::MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::
  ~MemPool(&local_270);
  local_288 = &PTR__MemContext_00105d90;
  local_280 = &local_2a8;
  local_278 = &local_2a9;
  local_270.m_arena = &local_2a8;
  local_270.m_logger = &local_2a9;
  memset(&local_270.m_footprintLimit,0,0x232);
  local_270.m_paddingByte = -0x33;
  pvVar1 = cookmem::
           MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::
           allocate(&local_270,100);
  pvVar1 = cookmem::
           MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::
           reallocate(&local_270,pvVar1,1000);
  cookmem::MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::
  deallocate(&local_270,pvVar1,0);
  local_288 = &PTR__MemContext_00105d90;
  cookmem::MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::
  ~MemPool(&local_270);
  return 0;
}

Assistant:

int
main (int argc, const char* argv[])
{
    cookmem::MmapArena arena;
    cookmem::CachedArena<cookmem::MmapArena> cachedArena (arena);
    cookmem::NoActionMemLogger logger;

    typedef cookmem::MemContext<cookmem::CachedArena<cookmem::MmapArena>, cookmem::NoActionMemLogger> CachedMemCtx;

    {
        CachedMemCtx memCtx (cachedArena, logger);

        // Allocate memory
        void* ptr = memCtx.allocate (100);

        // Change the size of the memory
        ptr = memCtx.reallocate (ptr, 1000);

        // Free the memory
        memCtx.deallocate (ptr);

        // Destructor of MemContext is called to release all allocated memory
        // segments back to cachedArena
    }

    {
        CachedMemCtx memCtx (cachedArena, logger);

        // Allocate memory.  The memory segment saved in cachedArena are re-used.
        void* ptr = memCtx.allocate (100);

        // Change the size of the memory
        ptr = memCtx.reallocate (ptr, 1000);

        // Free the memory
        memCtx.deallocate (ptr);

        // Destructor of MemContext is called to release all allocated memory
        // segments back to cachedArena
    }
    return 0;
}